

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Label __thiscall asmjit::Assembler::newLabel(Assembler *this)

{
  Error EVar1;
  long in_RSI;
  char *in_RDI;
  Label LVar2;
  Error err;
  uint32_t id;
  char *in_stack_00000350;
  int in_stack_0000035c;
  char *in_stack_00000360;
  char *message;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  CodeHolder *in_stack_ffffffffffffffa8;
  
  uVar3 = 0;
  message = in_RDI;
  if (*(int *)(in_RSI + 0x2c) == 0) {
    if (*(long *)(in_RSI + 0x18) == 0) {
      DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
    }
    EVar1 = CodeHolder::newLabelId
                      (in_stack_ffffffffffffffa8,
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (EVar1 != 0) {
      CodeEmitter::setLastError
                ((CodeEmitter *)CONCAT44(uVar3,EVar1),(Error)((ulong)in_RSI >> 0x20),message);
    }
  }
  *(ulong *)in_RDI = CONCAT44(uVar3,4);
  in_RDI[8] = '\0';
  in_RDI[9] = '\0';
  in_RDI[10] = '\0';
  in_RDI[0xb] = '\0';
  in_RDI[0xc] = '\0';
  in_RDI[0xd] = '\0';
  in_RDI[0xe] = '\0';
  in_RDI[0xf] = '\0';
  LVar2.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)0x0;
  LVar2.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)message;
  return (Label)LVar2.super_Operand.super_Operand_.field_0;
}

Assistant:

Label Assembler::newLabel() {
  uint32_t id = 0;
  if (!_lastError) {
    ASMJIT_ASSERT(_code != nullptr);
    Error err = _code->newLabelId(id);
    if (ASMJIT_UNLIKELY(err)) setLastError(err);
  }
  return Label(id);
}